

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QSettingsGroup>::eraseLast(QGenericArrayOps<QSettingsGroup> *this)

{
  QArrayDataPointer<QSettingsGroup> *in_RDI;
  
  QArrayDataPointer<QSettingsGroup>::end(in_RDI);
  QSettingsGroup::~QSettingsGroup((QSettingsGroup *)0x7d7468);
  in_RDI->size = in_RDI->size + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }